

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  undefined1 *puVar1;
  byte bVar2;
  HUF_DTable *pHVar3;
  HUF_DTable *pHVar4;
  int iVar5;
  BIT_DStream_status BVar6;
  BIT_DStream_status BVar7;
  BIT_DStream_status BVar8;
  BIT_DStream_status BVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  undefined1 *puVar15;
  int iVar16;
  undefined1 *puVar17;
  int iVar18;
  undefined1 *puVar19;
  undefined4 in_register_0000008c;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  char cVar24;
  HUF_DTable *pHVar25;
  bool bVar26;
  BIT_DStream_t local_118;
  BIT_DStream_t local_f0;
  BIT_DStream_t local_c8;
  BIT_DStream_t local_a0;
  undefined1 *local_78;
  HUF_DTable *local_70;
  ulong local_68;
  undefined1 *local_60;
  ulong local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar10 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,dstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar10 != 0)) {
      return sVar10;
    }
    sVar10 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar10;
  }
  if (dstSize < 6 || cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar22 = (ulong)*cSrc;
  uVar21 = (ulong)*(ushort *)((long)cSrc + 2);
  uVar20 = (ulong)*(ushort *)((long)cSrc + 4);
  uVar11 = uVar20 + 6 + uVar22 + uVar21;
  if (cSrcSize < uVar11) {
    return 0xffffffffffffffec;
  }
  local_78 = (undefined1 *)((long)dst + dstSize);
  local_68 = dstSize + 3 >> 2;
  puVar1 = (undefined1 *)((long)dst + local_68);
  local_50 = puVar1 + local_68;
  local_38 = local_50 + local_68;
  if (local_78 < local_38) {
    return 0xffffffffffffffec;
  }
  local_58 = (ulong)*(ushort *)((long)DTable + 2);
  local_70 = DTable;
  local_48 = dstSize;
  sVar10 = BIT_initDStream(&local_a0,(void *)((long)cSrc + 6),uVar22);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  pvVar23 = (void *)((long)cSrc + uVar22 + 6);
  sVar10 = BIT_initDStream(&local_c8,pvVar23,uVar21);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  pvVar23 = (void *)((long)pvVar23 + uVar21);
  sVar10 = BIT_initDStream(&local_f0,pvVar23,uVar20);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  sVar10 = BIT_initDStream(&local_118,(void *)((long)pvVar23 + uVar20),cSrcSize - uVar11);
  pHVar3 = local_70;
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  local_40 = (undefined1 *)((long)dst + (local_48 - 3));
  cVar24 = (char)local_58;
  puVar15 = puVar1;
  puVar17 = local_38;
  puVar19 = local_50;
  if (7 < (ulong)((long)local_78 - (long)local_38)) {
    bVar12 = -cVar24 & 0x3f;
    local_70 = (HUF_DTable *)(local_68 * 3);
    bVar26 = true;
    pHVar25 = local_70;
    while ((pHVar4 = local_70, bVar26 && ((undefined1 *)((long)dst + (long)pHVar25) < local_40))) {
      uVar11 = (local_a0.bitContainer << ((byte)local_a0.bitsConsumed & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_c8.bitContainer << ((byte)local_c8.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = bVar2 + local_a0.bitsConsumed;
      iVar13 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_c8.bitsConsumed;
      *(undefined1 *)((long)dst + local_68) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_f0.bitContainer << ((byte)local_f0.bitsConsumed & 0x3f)) >> bVar12;
      iVar16 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_f0.bitsConsumed;
      *(undefined1 *)((long)dst + local_68 * 2) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar20 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> bVar12;
      uVar21 = (local_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar18 = *(byte *)((long)pHVar3 + uVar20 * 2 + 4) + local_118.bitsConsumed;
      uVar11 = (local_c8.bitContainer << ((byte)iVar13 & 0x3f)) >> bVar12;
      uVar22 = (local_f0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + (long)local_70) = *(undefined1 *)((long)pHVar3 + uVar20 * 2 + 5);
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar21 * 2 + 4) + iVar5;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)pHVar3 + uVar21 * 2 + 5);
      iVar13 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar13;
      *(undefined1 *)((long)dst + local_68 + 1) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      iVar16 = (uint)*(byte *)((long)pHVar3 + uVar22 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + local_68 * 2 + 1) = *(undefined1 *)((long)pHVar3 + uVar22 * 2 + 5)
      ;
      uVar11 = (local_118.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar12;
      uVar20 = (local_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar18 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar18;
      uVar21 = (local_c8.bitContainer << ((byte)iVar13 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + (long)local_70 + 1) =
           *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar20 * 2 + 4) + iVar5;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)pHVar3 + uVar20 * 2 + 5);
      iVar13 = (uint)*(byte *)((long)pHVar3 + uVar21 * 2 + 4) + iVar13;
      uVar11 = (local_f0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + local_68 + 2) = *(undefined1 *)((long)pHVar3 + uVar21 * 2 + 5);
      iVar16 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + local_68 * 2 + 2) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5)
      ;
      uVar11 = (local_118.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar12;
      iVar18 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar18;
      *(undefined1 *)((long)dst + (long)local_70 + 2) =
           *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      uVar20 = (local_c8.bitContainer << ((byte)iVar13 & 0x3f)) >> bVar12;
      uVar21 = (local_f0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar12;
      local_a0.bitsConsumed = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      local_60 = (undefined1 *)((long)dst + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      local_c8.bitsConsumed = (uint)*(byte *)((long)pHVar3 + uVar20 * 2 + 4) + iVar13;
      *(undefined1 *)((long)dst + local_68 + 3) = *(undefined1 *)((long)pHVar3 + uVar20 * 2 + 5);
      local_f0.bitsConsumed = (uint)*(byte *)((long)pHVar3 + uVar21 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + local_68 * 2 + 3) = *(undefined1 *)((long)pHVar3 + uVar21 * 2 + 5)
      ;
      uVar11 = (local_118.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar12;
      local_118.bitsConsumed = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar18;
      *(undefined1 *)((long)dst + (long)local_70 + 3) =
           *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      BVar6 = BIT_reloadDStreamFast(&local_a0);
      BVar7 = BIT_reloadDStreamFast(&local_c8);
      BVar8 = BIT_reloadDStreamFast(&local_f0);
      BVar9 = BIT_reloadDStreamFast(&local_118);
      bVar26 = BVar9 == BIT_DStream_unfinished &&
               (BVar8 == BIT_DStream_unfinished &&
               (BVar7 == BIT_DStream_unfinished && BVar6 == BIT_DStream_unfinished));
      dst = local_60;
      pHVar25 = pHVar4;
    }
    cVar24 = (char)local_58;
    puVar15 = (undefined1 *)((long)dst + local_68);
    puVar17 = (undefined1 *)((long)dst + (long)pHVar25);
    puVar19 = (undefined1 *)((long)dst + local_68 * 2);
  }
  if (local_38 < puVar19 || (local_50 < puVar15 || puVar1 < dst)) {
    return 0xffffffffffffffec;
  }
  if ((long)puVar1 - (long)dst < 4) {
    if (local_a0.bitsConsumed < 0x41) {
      if (local_a0.ptr < local_a0.limitPtr) {
        if (local_a0.ptr == local_a0.start) goto LAB_003d59e8;
        uVar14 = (int)local_a0.ptr - (int)local_a0.start;
        if (local_a0.start <=
            (BitContainerType *)((long)local_a0.ptr - (ulong)(local_a0.bitsConsumed >> 3))) {
          uVar14 = local_a0.bitsConsumed >> 3;
        }
        local_a0.bitsConsumed = local_a0.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = local_a0.bitsConsumed >> 3;
        local_a0.bitsConsumed = local_a0.bitsConsumed & 7;
      }
      local_a0.ptr = (char *)((long)local_a0.ptr - (ulong)uVar14);
      local_a0.bitContainer = *(BitContainerType *)local_a0.ptr;
    }
    else {
      local_a0.ptr = "";
    }
  }
  else {
    bVar12 = -cVar24 & 0x3f;
    while (local_a0.bitsConsumed < 0x41) {
      if (local_a0.ptr < local_a0.limitPtr) {
        if (local_a0.ptr == local_a0.start) goto LAB_003d59e8;
        bVar26 = local_a0.start <=
                 (BitContainerType *)((long)local_a0.ptr - (ulong)(local_a0.bitsConsumed >> 3));
        uVar11 = (ulong)(uint)((int)local_a0.ptr - (int)local_a0.start);
        if (bVar26) {
          uVar11 = (ulong)(local_a0.bitsConsumed >> 3);
        }
        local_a0.bitsConsumed = local_a0.bitsConsumed + (int)uVar11 * -8;
      }
      else {
        uVar11 = (ulong)(local_a0.bitsConsumed >> 3);
        local_a0.bitsConsumed = local_a0.bitsConsumed & 7;
        bVar26 = true;
      }
      local_a0.ptr = (char *)((long)local_a0.ptr - uVar11);
      local_a0.bitContainer = *(BitContainerType *)local_a0.ptr;
      if ((puVar1 + -3 <= dst) || (!bVar26)) goto LAB_003d59e8;
      uVar11 = (local_a0.bitContainer << ((byte)local_a0.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_a0.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      dst = (void *)((long)dst + 4);
      local_a0.bitsConsumed = (uint)bVar2 + iVar5;
    }
    local_a0.ptr = "";
  }
LAB_003d59e8:
  bVar12 = -cVar24 & 0x3f;
  for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
    uVar11 = (local_a0.bitContainer << ((byte)local_a0.bitsConsumed & 0x3f)) >> bVar12;
    local_a0.bitsConsumed = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_a0.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
  }
  if ((long)local_50 - (long)puVar15 < 4) {
    if (0x40 < local_c8.bitsConsumed) goto LAB_003d5bf4;
    if (local_c8.ptr < local_c8.limitPtr) {
      if (local_c8.ptr != local_c8.start) {
        uVar14 = (int)local_c8.ptr - (int)local_c8.start;
        if (local_c8.start <=
            (BitContainerType *)((long)local_c8.ptr - (ulong)(local_c8.bitsConsumed >> 3))) {
          uVar14 = local_c8.bitsConsumed >> 3;
        }
        local_c8.bitsConsumed = local_c8.bitsConsumed + uVar14 * -8;
        goto LAB_003d5be6;
      }
    }
    else {
      uVar14 = local_c8.bitsConsumed >> 3;
      local_c8.bitsConsumed = local_c8.bitsConsumed & 7;
LAB_003d5be6:
      local_c8.ptr = (char *)((long)local_c8.ptr - (ulong)uVar14);
      local_c8.bitContainer = *(BitContainerType *)local_c8.ptr;
    }
  }
  else {
    while (local_c8.bitsConsumed < 0x41) {
      if (local_c8.ptr < local_c8.limitPtr) {
        if (local_c8.ptr == local_c8.start) goto LAB_003d5c2c;
        bVar26 = local_c8.start <=
                 (BitContainerType *)((long)local_c8.ptr - (ulong)(local_c8.bitsConsumed >> 3));
        uVar14 = (int)local_c8.ptr - (int)local_c8.start;
        if (bVar26) {
          uVar14 = local_c8.bitsConsumed >> 3;
        }
        local_c8.bitsConsumed = local_c8.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = local_c8.bitsConsumed >> 3;
        local_c8.bitsConsumed = local_c8.bitsConsumed & 7;
        bVar26 = true;
      }
      local_c8.ptr = (char *)((long)local_c8.ptr - (ulong)uVar14);
      local_c8.bitContainer = *(BitContainerType *)local_c8.ptr;
      if ((local_50 + -3 <= puVar15) || (!bVar26)) goto LAB_003d5c2c;
      uVar11 = (local_c8.bitContainer << ((byte)local_c8.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_c8.bitsConsumed;
      *puVar15 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_c8.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar15[1] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_c8.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar15[2] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_c8.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      puVar15[3] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      puVar15 = puVar15 + 4;
      local_c8.bitsConsumed = (uint)bVar2 + iVar5;
    }
LAB_003d5bf4:
    local_c8.ptr = "";
  }
LAB_003d5c2c:
  for (; puVar15 < local_50; puVar15 = puVar15 + 1) {
    uVar11 = (local_c8.bitContainer << ((byte)local_c8.bitsConsumed & 0x3f)) >> bVar12;
    local_c8.bitsConsumed = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_c8.bitsConsumed;
    *puVar15 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
  }
  if ((long)local_38 - (long)puVar19 < 4) {
    if (0x40 < local_f0.bitsConsumed) goto LAB_003d5de3;
    if (local_f0.ptr < local_f0.limitPtr) {
      if (local_f0.ptr != local_f0.start) {
        uVar14 = (int)local_f0.ptr - (int)local_f0.start;
        if (local_f0.start <=
            (BitContainerType *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3))) {
          uVar14 = local_f0.bitsConsumed >> 3;
        }
        local_f0.bitsConsumed = local_f0.bitsConsumed + uVar14 * -8;
        goto LAB_003d5dd5;
      }
    }
    else {
      uVar14 = local_f0.bitsConsumed >> 3;
      local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
LAB_003d5dd5:
      local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)uVar14);
      local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
    }
  }
  else {
    while (local_f0.bitsConsumed < 0x41) {
      if (local_f0.ptr < local_f0.limitPtr) {
        if (local_f0.ptr == local_f0.start) goto LAB_003d5e1b;
        bVar26 = local_f0.start <=
                 (BitContainerType *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3));
        uVar14 = (int)local_f0.ptr - (int)local_f0.start;
        if (bVar26) {
          uVar14 = local_f0.bitsConsumed >> 3;
        }
        local_f0.bitsConsumed = local_f0.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = local_f0.bitsConsumed >> 3;
        local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
        bVar26 = true;
      }
      local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)uVar14);
      local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
      if ((local_38 + -3 <= puVar19) || (!bVar26)) goto LAB_003d5e1b;
      uVar11 = (local_f0.bitContainer << ((byte)local_f0.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_f0.bitsConsumed;
      *puVar19 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_f0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar19[1] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_f0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar19[2] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_f0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      puVar19[3] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      puVar19 = puVar19 + 4;
      local_f0.bitsConsumed = (uint)bVar2 + iVar5;
    }
LAB_003d5de3:
    local_f0.ptr = "";
  }
LAB_003d5e1b:
  for (; puVar19 < local_38; puVar19 = puVar19 + 1) {
    uVar11 = (local_f0.bitContainer << ((byte)local_f0.bitsConsumed & 0x3f)) >> bVar12;
    local_f0.bitsConsumed = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_f0.bitsConsumed;
    *puVar19 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
  }
  if ((long)local_78 - (long)puVar17 < 4) {
    if (local_118.bitsConsumed < 0x41) {
      if (local_118.ptr < local_118.limitPtr) {
        if (local_118.ptr == local_118.start) goto LAB_003d6038;
        uVar14 = (int)local_118.ptr - (int)local_118.start;
        if (local_118.start <=
            (BitContainerType *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
          uVar14 = local_118.bitsConsumed >> 3;
        }
        local_118.bitsConsumed = local_118.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = local_118.bitsConsumed >> 3;
        local_118.bitsConsumed = local_118.bitsConsumed & 7;
      }
      local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar14);
      local_118.bitContainer = *(BitContainerType *)local_118.ptr;
    }
    else {
      local_118.ptr = "";
    }
  }
  else {
    while (local_118.bitsConsumed < 0x41) {
      if (local_118.ptr < local_118.limitPtr) {
        if (local_118.ptr == local_118.start) goto LAB_003d6038;
        bVar26 = local_118.start <=
                 (BitContainerType *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3));
        uVar14 = (int)local_118.ptr - (int)local_118.start;
        if (bVar26) {
          uVar14 = local_118.bitsConsumed >> 3;
        }
        local_118.bitsConsumed = local_118.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = local_118.bitsConsumed >> 3;
        local_118.bitsConsumed = local_118.bitsConsumed & 7;
        bVar26 = true;
      }
      local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar14);
      local_118.bitContainer = *(BitContainerType *)local_118.ptr;
      if ((local_40 <= puVar17) || (!bVar26)) goto LAB_003d6038;
      uVar11 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_118.bitsConsumed;
      *puVar17 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_118.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar17[1] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_118.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar17[2] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (local_118.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      puVar17[3] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      puVar17 = puVar17 + 4;
      local_118.bitsConsumed = (uint)bVar2 + iVar5;
    }
    local_118.ptr = "";
  }
LAB_003d6038:
  for (; puVar17 < local_78; puVar17 = puVar17 + 1) {
    uVar11 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> bVar12;
    local_118.bitsConsumed = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + local_118.bitsConsumed;
    *puVar17 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
  }
  sVar10 = 0xffffffffffffffec;
  if (local_118.bitsConsumed != 0x40) {
    local_48 = sVar10;
  }
  if (local_118.ptr != local_118.start) {
    local_48 = sVar10;
  }
  if (local_f0.bitsConsumed != 0x40) {
    local_48 = sVar10;
  }
  if (local_f0.ptr != local_f0.start) {
    local_48 = sVar10;
  }
  if (local_c8.bitsConsumed != 0x40) {
    local_48 = sVar10;
  }
  if (local_c8.ptr != local_c8.start) {
    local_48 = sVar10;
  }
  if (local_a0.bitsConsumed != 0x40) {
    local_48 = sVar10;
  }
  if (local_a0.ptr != local_a0.start) {
    local_48 = sVar10;
  }
  return local_48;
}

Assistant:

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif
    if (HUF_ENABLE_FAST_DECODE && !(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}